

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world_synth.cc
# Opt level: O1

int main(int argc,char **argv)

{
  double __x;
  uint uVar1;
  char *pcVar2;
  char *pcVar3;
  long lVar4;
  long lVar5;
  pointer pdVar6;
  bool bVar7;
  char cVar8;
  bool bVar9;
  int iVar10;
  int iVar11;
  ostream *poVar12;
  size_t sVar13;
  double *pdVar14;
  long lVar15;
  char *pcVar16;
  string *input_stream;
  int iVar17;
  double dVar18;
  int fft_length;
  int frame_shift;
  vector<double,_std::allocator<double>_> f0;
  int tmp;
  double sampling_rate;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  aperiodicity;
  vector<double,_std::allocator<double>_> waveform;
  WorldSynthesis world_synthesis;
  ostringstream error_message;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  spectrum;
  int local_4a0;
  int local_49c;
  char *local_498;
  InputOutputFormats local_48c;
  vector<double,_std::allocator<double>_> local_488;
  double local_470;
  SpectrumToSpectrum local_468;
  double local_420;
  string local_418;
  ulong local_3f0;
  vector<double,_std::allocator<double>_> local_3e8;
  undefined1 local_3d0 [16];
  double local_3c0 [12];
  ios_base local_360 [264];
  char *local_258;
  string local_250;
  uint auStack_230 [20];
  ios_base local_1e0 [408];
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_48;
  
  local_4a0 = 0x400;
  local_49c = 0x50;
  local_420 = 16.0;
  local_3f0 = 0;
  local_48c = kLogAmplitudeSpectrumInDecibels;
  local_498 = (char *)((ulong)local_498 & 0xffffffff00000000);
  iVar17 = 0;
  do {
    iVar10 = ya_getopt_long(argc,argv,"l:p:s:F:S:A:h",(option *)0x0,(int *)0x0);
    if (iVar10 < 0x68) {
      if (iVar10 < 0x46) {
        if (iVar10 == -1) {
          iVar10 = 2;
          goto LAB_00103ffa;
        }
        if (iVar10 != 0x41) goto LAB_00103c0e;
        std::__cxx11::string::string((string *)&local_250,ya_optarg,(allocator *)local_3d0);
        bVar7 = sptk::ConvertStringToInteger(&local_250,(int *)&local_468);
        if (bVar7) {
          bVar7 = sptk::IsInRange((InputOutputFormats)local_468._vptr_SpectrumToSpectrum,0,3);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_250._M_dataplus._M_p != &local_250.field_2) {
            operator_delete(local_250._M_dataplus._M_p);
          }
          if (bVar7) {
            iVar10 = 4;
            bVar7 = true;
            local_3f0 = (ulong)local_468._vptr_SpectrumToSpectrum & 0xffffffff;
            goto LAB_00103ff4;
          }
        }
        else if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_250._M_dataplus._M_p != &local_250.field_2) {
          operator_delete(local_250._M_dataplus._M_p);
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_250);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_250,"The argument for the -A option must be an integer ",0x32);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_250,"in the range of ",0x10);
        poVar12 = (ostream *)std::ostream::operator<<((ostream *)&local_250,0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12," to ",4);
        std::ostream::operator<<((ostream *)poVar12,3);
        local_3d0._0_8_ = local_3c0;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_3d0,"world_synth","");
        sptk::PrintErrorMessage((string *)local_3d0,(ostringstream *)&local_250);
LAB_00103fb1:
        if ((double *)local_3d0._0_8_ != local_3c0) {
          operator_delete((void *)local_3d0._0_8_);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_250);
        std::ios_base::~ios_base(local_1e0);
        iVar10 = 1;
        bVar7 = false;
        iVar17 = 1;
      }
      else {
        if (iVar10 != 0x46) {
          if (iVar10 != 0x53) goto LAB_00103c0e;
          std::__cxx11::string::string((string *)&local_250,ya_optarg,(allocator *)local_3d0);
          bVar7 = sptk::ConvertStringToInteger(&local_250,(int *)&local_468);
          if (bVar7) {
            bVar7 = sptk::IsInRange((InputOutputFormats)local_468._vptr_SpectrumToSpectrum,0,3);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_250._M_dataplus._M_p != &local_250.field_2) {
              operator_delete(local_250._M_dataplus._M_p);
            }
            if (bVar7) {
              iVar10 = 4;
              bVar7 = true;
              local_48c = (InputOutputFormats)local_468._vptr_SpectrumToSpectrum;
              goto LAB_00103ff4;
            }
          }
          else if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)local_250._M_dataplus._M_p != &local_250.field_2) {
            operator_delete(local_250._M_dataplus._M_p);
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_250);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_250,"The argument for the -S option must be an integer ",0x32
                    );
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_250,"in the range of ",0x10);
          poVar12 = (ostream *)std::ostream::operator<<((ostream *)&local_250,0);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12," to ",4);
          std::ostream::operator<<((ostream *)poVar12,3);
          local_3d0._0_8_ = local_3c0;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_3d0,"world_synth","");
          sptk::PrintErrorMessage((string *)local_3d0,(ostringstream *)&local_250);
          goto LAB_00103fb1;
        }
        std::__cxx11::string::string((string *)&local_250,ya_optarg,(allocator *)local_3d0);
        bVar7 = sptk::ConvertStringToInteger(&local_250,(int *)&local_468);
        if (!bVar7) {
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_250._M_dataplus._M_p != &local_250.field_2) {
            operator_delete(local_250._M_dataplus._M_p);
          }
LAB_00103c39:
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_250);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_250,"The argument for the -F option must be an integer ",0x32
                    );
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_250,"in the range of ",0x10);
          poVar12 = (ostream *)std::ostream::operator<<((ostream *)&local_250,0);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12," to ",4);
          std::ostream::operator<<((ostream *)poVar12,2);
          local_3d0._0_8_ = local_3c0;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_3d0,"world_synth","");
          sptk::PrintErrorMessage((string *)local_3d0,(ostringstream *)&local_250);
          goto LAB_00103fb1;
        }
        bVar7 = sptk::IsInRange((InputOutputFormats)local_468._vptr_SpectrumToSpectrum,0,2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_250._M_dataplus._M_p != &local_250.field_2) {
          operator_delete(local_250._M_dataplus._M_p);
        }
        if (!bVar7) goto LAB_00103c39;
        iVar10 = 4;
        bVar7 = true;
        local_498 = (char *)CONCAT44(local_498._4_4_,
                                     (InputOutputFormats)local_468._vptr_SpectrumToSpectrum);
      }
LAB_00103ff4:
      if (bVar7) {
LAB_00103ff8:
        iVar10 = 0;
      }
    }
    else {
      if (0x6f < iVar10) {
        if (iVar10 != 0x70) {
          if (iVar10 == 0x73) {
            std::__cxx11::string::string((string *)&local_250,ya_optarg,(allocator *)local_3d0);
            bVar7 = sptk::ConvertStringToDouble(&local_250,&local_420);
            if (bVar7) {
              bVar7 = sptk::IsInRange(local_420,8.0,98.0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_250._M_dataplus._M_p != &local_250.field_2) {
                operator_delete(local_250._M_dataplus._M_p);
              }
              if (bVar7) {
                iVar10 = 4;
                bVar7 = true;
                goto LAB_00103ff4;
              }
            }
            else if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)local_250._M_dataplus._M_p != &local_250.field_2) {
              operator_delete(local_250._M_dataplus._M_p);
            }
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_250);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_250,"The argument for the -s option must be in a number ",
                       0x33);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_250,"in the interval [",0x11);
            poVar12 = std::ostream::_M_insert<double>(8.0);
            std::__ostream_insert<char,std::char_traits<char>>(poVar12,", ",2);
            poVar12 = std::ostream::_M_insert<double>(98.0);
            std::__ostream_insert<char,std::char_traits<char>>(poVar12,"]",1);
            local_3d0._0_8_ = local_3c0;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_3d0,"world_synth","");
            sptk::PrintErrorMessage((string *)local_3d0,(ostringstream *)&local_250);
            goto LAB_00103fb1;
          }
          goto LAB_00103c0e;
        }
        std::__cxx11::string::string((string *)&local_250,ya_optarg,(allocator *)local_3d0);
        bVar9 = sptk::ConvertStringToInteger(&local_250,&local_49c);
        bVar7 = local_49c < 1;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_250._M_dataplus._M_p != &local_250.field_2) {
          operator_delete(local_250._M_dataplus._M_p);
        }
        if (!bVar9 || bVar7) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_250);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_250,
                     "The argument for the -p option must be a positive integer",0x39);
          local_3d0._0_8_ = local_3c0;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_3d0,"world_synth","");
          sptk::PrintErrorMessage((string *)local_3d0,(ostringstream *)&local_250);
LAB_00103d31:
          if ((double *)local_3d0._0_8_ != local_3c0) {
            operator_delete((void *)local_3d0._0_8_);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_250);
          std::ios_base::~ios_base(local_1e0);
          goto LAB_00103d67;
        }
        goto LAB_00103ff8;
      }
      if (iVar10 == 0x68) {
        anon_unknown.dwarf_418a::PrintUsage((ostream *)&std::cout);
        iVar17 = 0;
        iVar10 = 1;
        goto LAB_00103ffa;
      }
      if (iVar10 == 0x6c) {
        std::__cxx11::string::string((string *)&local_250,ya_optarg,(allocator *)local_3d0);
        bVar9 = sptk::ConvertStringToInteger(&local_250,&local_4a0);
        bVar7 = local_4a0 < 0x200;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_250._M_dataplus._M_p != &local_250.field_2) {
          operator_delete(local_250._M_dataplus._M_p);
        }
        if (!bVar9 || bVar7) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_250);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_250,"The argument for the -l option must be at least 512",
                     0x33);
          local_3d0._0_8_ = local_3c0;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_3d0,"world_synth","");
          sptk::PrintErrorMessage((string *)local_3d0,(ostringstream *)&local_250);
          goto LAB_00103d31;
        }
        goto LAB_00103ff8;
      }
LAB_00103c0e:
      anon_unknown.dwarf_418a::PrintUsage((ostream *)&std::cerr);
LAB_00103d67:
      iVar10 = 1;
      iVar17 = 1;
    }
LAB_00103ffa:
  } while (iVar10 == 0);
  if (iVar10 != 2) {
    return iVar17;
  }
  if (argc - ya_optind == 2) {
    lVar4 = (long)argc + -2;
    lVar5 = (long)argc + -1;
    pcVar16 = (char *)0x0;
  }
  else {
    if (argc - ya_optind != 3) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_250);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_250,
                 "Just three input files, spfile, apfile, and f0file are required",0x3f);
      local_3d0._0_8_ = local_3c0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_3d0,"world_synth","");
      sptk::PrintErrorMessage((string *)local_3d0,(ostringstream *)&local_250);
      goto LAB_00104262;
    }
    lVar15 = (long)argc;
    lVar4 = lVar15 + -3;
    lVar5 = lVar15 + -2;
    pcVar16 = argv[lVar15 + -1];
  }
  pcVar2 = argv[lVar4];
  pcVar3 = argv[lVar5];
  bVar7 = sptk::SetBinaryMode();
  iVar10 = local_4a0;
  if (!bVar7) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_250);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_250,"Cannot set translation mode",0x1b);
    local_3d0._0_8_ = local_3c0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3d0,"world_synth","");
    sptk::PrintErrorMessage((string *)local_3d0,(ostringstream *)&local_250);
LAB_00104262:
    if ((double *)local_3d0._0_8_ != local_3c0) {
      operator_delete((void *)local_3d0._0_8_);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_250);
    std::ios_base::~ios_base(local_1e0);
    return 1;
  }
  local_470 = local_420;
  local_488.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (double *)0x0;
  local_488.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (double *)0x0;
  local_488.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (double *)0x0;
  input_stream = &local_250;
  local_258 = pcVar2;
  std::ifstream::ifstream(input_stream);
  local_470 = local_470 * 1000.0;
  if ((pcVar16 == (char *)0x0) ||
     (std::ifstream::open((char *)&local_250,(_Ios_Openmode)pcVar16),
     (*(byte *)((long)auStack_230 + *(long *)(local_250._M_dataplus._M_p + -0x18)) & 5) == 0)) {
    cVar8 = std::__basic_file<char>::is_open();
    if (cVar8 == '\0') {
      input_stream = (string *)&std::cin;
    }
    while (bVar7 = sptk::ReadStream<double>((double *)local_3d0,(istream *)input_stream),
          pdVar6 = local_488.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish, bVar7) {
      if (local_488.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_488.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  ((vector<double,std::allocator<double>> *)&local_488,
                   (iterator)
                   local_488.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish,(double *)local_3d0);
      }
      else {
        *local_488.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish = (double)local_3d0._0_8_;
        local_488.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_488.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
    }
    pdVar14 = local_488.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((int)local_498 == 2) {
      for (; pdVar14 != pdVar6; pdVar14 = pdVar14 + 1) {
        __x = *pdVar14;
        dVar18 = 0.0;
        if ((__x != -10000000000.0) || (NAN(__x))) {
          dVar18 = exp(__x);
        }
        *pdVar14 = dVar18;
      }
    }
    else if ((int)local_498 == 0) {
      for (; pdVar14 !=
             local_488.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish; pdVar14 = pdVar14 + 1) {
        *pdVar14 = (double)(~-(ulong)(*pdVar14 == 0.0) & (ulong)(local_470 / *pdVar14));
      }
    }
    bVar7 = true;
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3d0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_3d0,"Cannot open file ",0x11);
    sVar13 = strlen(pcVar16);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3d0,pcVar16,sVar13);
    local_468._vptr_SpectrumToSpectrum = (_func_int **)&local_468.output_format_;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_468,"world_synth","");
    sptk::PrintErrorMessage((string *)&local_468,(ostringstream *)local_3d0);
    if (local_468._vptr_SpectrumToSpectrum != (_func_int **)&local_468.output_format_) {
      operator_delete(local_468._vptr_SpectrumToSpectrum);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3d0);
    std::ios_base::~ios_base(local_360);
    iVar17 = 1;
    bVar7 = false;
  }
  std::ifstream::~ifstream(&local_250);
  if (!bVar7) goto LAB_00104bc3;
  if (local_488.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start ==
      local_488.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    iVar17 = 0;
    goto LAB_00104bc3;
  }
  local_48.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::reserve(&local_48,
            (long)local_488.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_488.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3);
  local_498 = pcVar3;
  sptk::SpectrumToSpectrum::SpectrumToSpectrum
            (&local_468,local_4a0,local_48c,kPowerSpectrum,0.0,-1.79769313486232e+308);
  iVar10 = iVar10 / 2 + 1;
  if (local_468.is_valid_ == false) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_250);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_250,"FFT length must be a power of 2",0x1f);
    local_3d0._0_8_ = local_3c0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3d0,"world_synth","");
    sptk::PrintErrorMessage((string *)local_3d0,(ostringstream *)&local_250);
    if ((double *)local_3d0._0_8_ != local_3c0) {
      operator_delete((void *)local_3d0._0_8_);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_250);
    std::ios_base::~ios_base(local_1e0);
    iVar17 = 1;
    bVar7 = false;
  }
  else {
    std::ifstream::ifstream(&local_250);
    pcVar16 = local_258;
    std::ifstream::open((char *)&local_250,(_Ios_Openmode)local_258);
    if ((*(byte *)((long)auStack_230 + *(long *)(local_250._M_dataplus._M_p + -0x18)) & 5) == 0) {
      std::vector<double,_std::allocator<double>_>::vector
                (&local_3e8,(long)iVar10,(allocator_type *)local_3d0);
      while (bVar7 = sptk::ReadStream<double>
                               (false,0,0,iVar10,&local_3e8,(istream *)&local_250,(int *)0x0), bVar7
            ) {
        bVar9 = sptk::SpectrumToSpectrum::Run(&local_468,&local_3e8);
        if (!bVar9) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3d0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_3d0,"Failed to convert spectrum",0x1a);
          local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_418,"world_synth","");
          sptk::PrintErrorMessage(&local_418,(ostringstream *)local_3d0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_418._M_dataplus._M_p != &local_418.field_2) {
            operator_delete(local_418._M_dataplus._M_p);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3d0);
          std::ios_base::~ios_base(local_360);
          iVar17 = 1;
          break;
        }
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::push_back(&local_48,&local_3e8);
      }
      if (local_3e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_3e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      bVar7 = !bVar7;
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3d0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_3d0,"Cannot open file ",0x11);
      std::operator<<((ostream *)local_3d0,pcVar16);
      local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_418,"world_synth","");
      sptk::PrintErrorMessage(&local_418,(ostringstream *)local_3d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_418._M_dataplus._M_p != &local_418.field_2) {
        operator_delete(local_418._M_dataplus._M_p);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3d0);
      std::ios_base::~ios_base(local_360);
      iVar17 = 1;
      bVar7 = false;
    }
    std::ifstream::~ifstream(&local_250);
  }
  sptk::SpectrumToSpectrum::~SpectrumToSpectrum(&local_468);
  if (bVar7) {
    local_418._M_dataplus._M_p = (pointer)0x0;
    local_418._M_string_length = 0;
    local_418.field_2._M_allocated_capacity = 0;
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::reserve((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               *)&local_418,
              (long)local_488.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_488.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3);
    std::ifstream::ifstream(&local_250);
    std::ifstream::open((char *)&local_250,(_Ios_Openmode)local_498);
    uVar1 = *(uint *)((long)auStack_230 + *(long *)(local_250._M_dataplus._M_p + -0x18));
    if ((uVar1 & 5) == 0) {
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)local_3d0,(long)iVar10,
                 (allocator_type *)&local_468);
      while (bVar7 = sptk::ReadStream<double>
                               (false,0,0,iVar10,(value_type *)local_3d0,(istream *)&local_250,
                                (int *)0x0), bVar7) {
        iVar11 = (int)local_3f0;
        pdVar14 = (double *)local_3d0._0_8_;
        if (iVar11 == 1) {
          for (; pdVar14 != (double *)local_3d0._8_8_; pdVar14 = pdVar14 + 1) {
            *pdVar14 = 1.0 - *pdVar14;
          }
        }
        else if (iVar11 == 2) {
          for (; pdVar14 != (double *)local_3d0._8_8_; pdVar14 = pdVar14 + 1) {
            *pdVar14 = *pdVar14 / (*pdVar14 + 1.0);
          }
        }
        else if (iVar11 == 3) {
          for (; pdVar14 != (double *)local_3d0._8_8_; pdVar14 = pdVar14 + 1) {
            *pdVar14 = 1.0 / (*pdVar14 + 1.0);
          }
        }
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::push_back((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     *)&local_418,(value_type *)local_3d0);
      }
      if ((double *)local_3d0._0_8_ != (double *)0x0) {
        operator_delete((void *)local_3d0._0_8_);
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3d0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_3d0,"Cannot open file ",0x11);
      std::operator<<((ostream *)local_3d0,local_498);
      local_468._vptr_SpectrumToSpectrum = (_func_int **)&local_468.output_format_;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_468,"world_synth","");
      sptk::PrintErrorMessage((string *)&local_468,(ostringstream *)local_3d0);
      if (local_468._vptr_SpectrumToSpectrum != (_func_int **)&local_468.output_format_) {
        operator_delete(local_468._vptr_SpectrumToSpectrum);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3d0);
      std::ios_base::~ios_base(local_360);
      iVar17 = 1;
    }
    std::ifstream::~ifstream(&local_250);
    if ((uVar1 & 5) == 0) {
      sptk::WorldSynthesis::WorldSynthesis
                ((WorldSynthesis *)local_3d0,local_4a0,local_49c,local_470);
      if (local_3c0[1]._0_1_ == '\0') {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_250);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_250,"Failed to initialize WorldSynthesis",0x23);
        local_468._vptr_SpectrumToSpectrum = (_func_int **)&local_468.output_format_;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_468,"world_synth","");
        sptk::PrintErrorMessage((string *)&local_468,(ostringstream *)&local_250);
        if (local_468._vptr_SpectrumToSpectrum != (_func_int **)&local_468.output_format_) {
          operator_delete(local_468._vptr_SpectrumToSpectrum);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_250);
        std::ios_base::~ios_base(local_1e0);
        iVar17 = 1;
      }
      else {
        local_3e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_3e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_3e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        bVar7 = sptk::WorldSynthesis::Run
                          ((WorldSynthesis *)local_3d0,&local_488,&local_48,
                           (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            *)&local_418,&local_3e8);
        if (bVar7) {
          iVar17 = 0;
          bVar7 = sptk::WriteStream<double>
                            (0,(int)((ulong)((long)local_3e8.
                                                                                                      
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                            (long)local_3e8.
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 3),
                             &local_3e8,(ostream *)&std::cout,(int *)0x0);
          if (!bVar7) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_250);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_250,"Failed to write waveform",0x18);
            local_468._vptr_SpectrumToSpectrum = (_func_int **)&local_468.output_format_;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_468,"world_synth","");
            sptk::PrintErrorMessage((string *)&local_468,(ostringstream *)&local_250);
            goto LAB_00104b61;
          }
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_250);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_250,"Failed to synthesize waveform",0x1d);
          local_468._vptr_SpectrumToSpectrum = (_func_int **)&local_468.output_format_;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_468,"world_synth","");
          sptk::PrintErrorMessage((string *)&local_468,(ostringstream *)&local_250);
LAB_00104b61:
          if (local_468._vptr_SpectrumToSpectrum != (_func_int **)&local_468.output_format_) {
            operator_delete(local_468._vptr_SpectrumToSpectrum);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_250);
          std::ios_base::~ios_base(local_1e0);
          iVar17 = 1;
        }
        if (local_3e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_3e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
      }
    }
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               *)&local_418);
  }
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_48);
LAB_00104bc3:
  if (local_488.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start == (double *)0x0) {
    return iVar17;
  }
  operator_delete(local_488.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start);
  return iVar17;
}

Assistant:

int main(int argc, char* argv[]) {
  int fft_length(kDefaultFftLength);
  int frame_shift(kDefaultFrameShift);
  double sampling_rate(kDefaultSamplingRate);
  PitchFormats pitch_format(kDefaultPitchFormat);
  sptk::SpectrumToSpectrum::InputOutputFormats spectrum_format(
      kDefaultSpectrumFormat);
  AperiodicityFormats aperiodicity_format(kDefaultAperiodicityFormat);

  for (;;) {
    const int option_char(getopt_long(argc, argv, "l:p:s:F:S:A:h", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'l': {
        if (!sptk::ConvertStringToInteger(optarg, &fft_length) ||
            fft_length < 512) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -l option must be at least 512";
          sptk::PrintErrorMessage("world_synth", error_message);
          return 1;
        }
        break;
      }
      case 'p': {
        if (!sptk::ConvertStringToInteger(optarg, &frame_shift) ||
            frame_shift <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -p option must be a positive integer";
          sptk::PrintErrorMessage("world_synth", error_message);
          return 1;
        }
        break;
      }
      case 's': {
        const double min(8.0);
        const double max(98.0);
        if (!sptk::ConvertStringToDouble(optarg, &sampling_rate) ||
            !sptk::IsInRange(sampling_rate, min, max)) {
          std::ostringstream error_message;
          error_message << "The argument for the -s option must be in a number "
                        << "in the interval [" << min << ", " << max << "]";
          sptk::PrintErrorMessage("world_synth", error_message);
          return 1;
        }
        break;
      }
      case 'F': {
        const int min(0);
        const int max(static_cast<int>(kNumPitchFormats) - 1);
        int tmp;
        if (!sptk::ConvertStringToInteger(optarg, &tmp) ||
            !sptk::IsInRange(tmp, min, max)) {
          std::ostringstream error_message;
          error_message << "The argument for the -F option must be an integer "
                        << "in the range of " << min << " to " << max;
          sptk::PrintErrorMessage("world_synth", error_message);
          return 1;
        }
        pitch_format = static_cast<PitchFormats>(tmp);
        break;
      }
      case 'S': {
        const int min(0);
        const int max(
            static_cast<int>(sptk::SpectrumToSpectrum::kNumInputOutputFormats) -
            1);
        int tmp;
        if (!sptk::ConvertStringToInteger(optarg, &tmp) ||
            !sptk::IsInRange(tmp, min, max)) {
          std::ostringstream error_message;
          error_message << "The argument for the -S option must be an integer "
                        << "in the range of " << min << " to " << max;
          sptk::PrintErrorMessage("world_synth", error_message);
          return 1;
        }
        spectrum_format =
            static_cast<sptk::SpectrumToSpectrum::InputOutputFormats>(tmp);
        break;
      }
      case 'A': {
        const int min(0);
        const int max(static_cast<int>(kNumAperiodicityFormats) - 1);
        int tmp;
        if (!sptk::ConvertStringToInteger(optarg, &tmp) ||
            !sptk::IsInRange(tmp, min, max)) {
          std::ostringstream error_message;
          error_message << "The argument for the -A option must be an integer "
                        << "in the range of " << min << " to " << max;
          sptk::PrintErrorMessage("world_synth", error_message);
          return 1;
        }
        aperiodicity_format = static_cast<AperiodicityFormats>(tmp);
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  const char* spectrum_file;
  const char* aperiodicity_file;
  const char* f0_file;
  const int num_input_files(argc - optind);
  if (3 == num_input_files) {
    spectrum_file = argv[argc - 3];
    aperiodicity_file = argv[argc - 2];
    f0_file = argv[argc - 1];
  } else if (2 == num_input_files) {
    spectrum_file = argv[argc - 2];
    aperiodicity_file = argv[argc - 1];
    f0_file = NULL;
  } else {
    std::ostringstream error_message;
    error_message
        << "Just three input files, spfile, apfile, and f0file are required";
    sptk::PrintErrorMessage("world_synth", error_message);
    return 1;
  }

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("world_synth", error_message);
    return 1;
  }
  const int spectrum_size(fft_length / 2 + 1);
  const double sampling_rate_in_hz(1000.0 * sampling_rate);

  std::vector<double> f0;
  {
    std::ifstream ifs;
    if (NULL != f0_file) {
      ifs.open(f0_file, std::ios::in | std::ios::binary);
      if (ifs.fail()) {
        std::ostringstream error_message;
        error_message << "Cannot open file " << f0_file;
        sptk::PrintErrorMessage("world_synth", error_message);
        return 1;
      }
    }
    std::istream& input_stream(ifs.is_open() ? ifs : std::cin);

    double tmp;
    while (sptk::ReadStream(&tmp, &input_stream)) {
      f0.push_back(tmp);
    }

    switch (pitch_format) {
      case kPitch: {
        std::transform(f0.begin(), f0.end(), f0.begin(),
                       [sampling_rate_in_hz](double x) {
                         return (0.0 == x) ? 0.0 : sampling_rate_in_hz / x;
                       });
        break;
      }
      case kF0: {
        // nothing to do
        break;
      }
      case kLogF0: {
        std::transform(f0.begin(), f0.end(), f0.begin(), [](double x) {
          return (sptk::kLogZero == x) ? 0.0 : std::exp(x);
        });
        break;
      }
      default: {
        break;
      }
    }
  }
  if (f0.empty()) return 0;

  std::vector<std::vector<double>> spectrum;
  spectrum.reserve(f0.size());
  {
    sptk::SpectrumToSpectrum spectrum_to_spectrum(
        fft_length,
        static_cast<sptk::SpectrumToSpectrum::InputOutputFormats>(
            spectrum_format),
        sptk::SpectrumToSpectrum::InputOutputFormats::kPowerSpectrum);
    if (!spectrum_to_spectrum.IsValid()) {
      std::ostringstream error_message;
      error_message << "FFT length must be a power of 2";
      sptk::PrintErrorMessage("world_synth", error_message);
      return 1;
    }

    std::ifstream ifs;
    ifs.open(spectrum_file, std::ios::in | std::ios::binary);
    if (ifs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << spectrum_file;
      sptk::PrintErrorMessage("world_synth", error_message);
      return 1;
    }
    std::istream& input_stream(ifs);

    std::vector<double> tmp(spectrum_size);
    while (sptk::ReadStream(false, 0, 0, spectrum_size, &tmp, &input_stream,
                            NULL)) {
      if (!spectrum_to_spectrum.Run(&tmp)) {
        std::ostringstream error_message;
        error_message << "Failed to convert spectrum";
        sptk::PrintErrorMessage("world_synth", error_message);
        return 1;
      }
      spectrum.push_back(tmp);
    }
  }

  std::vector<std::vector<double>> aperiodicity;
  aperiodicity.reserve(f0.size());
  {
    std::ifstream ifs;
    ifs.open(aperiodicity_file, std::ios::in | std::ios::binary);
    if (ifs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << aperiodicity_file;
      sptk::PrintErrorMessage("world_synth", error_message);
      return 1;
    }
    std::istream& input_stream(ifs);

    std::vector<double> tmp(spectrum_size);
    while (sptk::ReadStream(false, 0, 0, spectrum_size, &tmp, &input_stream,
                            NULL)) {
      switch (aperiodicity_format) {
        case kAperiodicity: {
          // nothing to do
          break;
        }
        case kPeriodicity: {
          std::transform(tmp.begin(), tmp.end(), tmp.begin(),
                         [](double p) { return 1.0 - p; });
          break;
        }
        case kAperiodicityOverPeriodicity: {
          std::transform(tmp.begin(), tmp.end(), tmp.begin(),
                         [](double ap) { return ap / (1.0 + ap); });
          break;
        }
        case kPeriodicityOverAperiodicity: {
          std::transform(tmp.begin(), tmp.end(), tmp.begin(),
                         [](double pa) { return 1.0 / (1.0 + pa); });
          break;
        }
        default: {
          break;
        }
      }
      aperiodicity.push_back(tmp);
    }
  }

  sptk::WorldSynthesis world_synthesis(fft_length, frame_shift,
                                       sampling_rate_in_hz);
  if (!world_synthesis.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to initialize WorldSynthesis";
    sptk::PrintErrorMessage("world_synth", error_message);
    return 1;
  }

  std::vector<double> waveform;
  if (!world_synthesis.Run(f0, spectrum, aperiodicity, &waveform)) {
    std::ostringstream error_message;
    error_message << "Failed to synthesize waveform";
    sptk::PrintErrorMessage("world_synth", error_message);
    return 1;
  }

  if (!sptk::WriteStream(0, static_cast<int>(waveform.size()), waveform,
                         &std::cout, NULL)) {
    std::ostringstream error_message;
    error_message << "Failed to write waveform";
    sptk::PrintErrorMessage("world_synth", error_message);
    return 1;
  }

  return 0;
}